

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O2

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0U>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_0U> *this,executor_function *f)

{
  impl_base *piVar1;
  bool bVar2;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *op;
  function_type tmp;
  
  if (((this->bits_ & 1) == 0) &&
     (bVar2 = detail::scheduler::can_dispatch(this->io_context_->impl_), bVar2)) {
    piVar1 = f->impl_;
    f->impl_ = (impl_base *)0x0;
    tmp.impl_ = piVar1;
    if (piVar1 != (impl_base *)0x0) {
      tmp.impl_ = (impl_base *)0x0;
      (*piVar1->complete_)(piVar1,true);
    }
    detail::executor_function::~executor_function(&tmp);
    return;
  }
  tmp.impl_ = (impl_base *)&this->field_0x8;
  op = detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::ptr::allocate((allocator<void> *)tmp.impl_);
  (op->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (op->super_scheduler_operation).func_ =
       detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (op->super_scheduler_operation).task_result_ = 0;
  (op->handler_).impl_ = f->impl_;
  f->impl_ = (impl_base *)0x0;
  detail::scheduler::post_immediate_completion
            (this->io_context_->impl_,&op->super_scheduler_operation,SUB41((this->bits_ & 2) >> 1,0)
            );
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)&tmp);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits_ & blocking_never) == 0 && io_context_->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      io_context_->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = { detail::addressof(allocator_),
      op::ptr::allocate(allocator_), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f), allocator_);

  ASIO_HANDLER_CREATION((*io_context_, *p.p,
        "io_context", io_context_, 0, "execute"));

  io_context_->impl_.post_immediate_completion(p.p,
      (bits_ & relationship_continuation) != 0);
  p.v = p.p = 0;
}